

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  int local_194;
  pointer local_190;
  string out;
  StringPiece local_158;
  StringPiece vec [17];
  
  lVar3 = 8;
  do {
    *(undefined8 *)((long)vec + lVar3 + -8) = 0;
    *(undefined4 *)((long)&vec[0].ptr_ + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x118);
  uVar2 = MaxSubmatch(rewrite);
  local_194 = 0;
  if (uVar2 < 0x11) {
    pcVar5 = (str->_M_dataplus)._M_p;
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    pcVar4 = pcVar5 + str->_M_string_length;
    out.field_2._M_local_buf[0] = '\0';
    local_190 = (pointer)0x0;
    local_194 = 0;
    pcVar6 = pcVar5;
    while (pcVar5 <= pcVar4) {
      local_158.ptr_ = (str->_M_dataplus)._M_p;
      local_158.length_ = (int)str->_M_string_length;
      bVar1 = Match(re,&local_158,(int)pcVar6 - (int)local_158.ptr_,local_158.length_,UNANCHORED,vec
                    ,uVar2 + 1);
      if (!bVar1) break;
      if (pcVar5 < vec[0].ptr_) {
        std::__cxx11::string::append((char *)&out,(ulong)pcVar5);
      }
      if ((vec[0].ptr_ == local_190) && (vec[0].length_ == 0)) {
        if (pcVar5 < pcVar4) {
          std::__cxx11::string::append((char *)&out,(ulong)pcVar5);
        }
        pcVar5 = pcVar5 + 1;
        pcVar6 = pcVar6 + 1;
      }
      else {
        Rewrite(re,&out,rewrite,vec,uVar2 + 1);
        pcVar5 = vec[0].ptr_ + vec[0].length_;
        local_194 = local_194 + 1;
        pcVar6 = pcVar5;
        local_190 = pcVar5;
      }
    }
    if (local_194 != 0) {
      if (pcVar5 < pcVar4) {
        std::__cxx11::string::append((char *)&out,(ulong)pcVar5);
      }
      std::__cxx11::string::swap((string *)&out);
    }
    std::__cxx11::string::~string((string *)&out);
  }
  return local_194;
}

Assistant:

int RE2::GlobalReplace(string *str,
                      const RE2& re,
                      const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  string out;
  int count = 0;
  while (p <= ep) {
    if (!re.Match(*str, static_cast<int>(p - str->data()),
                  static_cast<int>(str->size()), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].begin())
      out.append(p, vec[0].begin() - p);
    if (vec[0].begin() == lastend && vec[0].size() == 0) {
      // Disallow empty match at end of last match: skip ahead.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].end();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  swap(out, *str);
  return count;
}